

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlCopyNamespaceList(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr pxVar3;
  xmlNsPtr pxVar4;
  
  pxVar3 = (xmlNsPtr)0x0;
  pxVar4 = (xmlNsPtr)0x0;
  for (; cur != (xmlNsPtr)0x0; cur = cur->next) {
    pxVar1 = xmlCopyNamespace(cur);
    pxVar2 = pxVar1;
    if (pxVar4 != (xmlNsPtr)0x0) {
      pxVar4->next = pxVar1;
      pxVar2 = pxVar3;
    }
    pxVar3 = pxVar2;
    pxVar4 = pxVar1;
  }
  return pxVar3;
}

Assistant:

xmlNsPtr
xmlCopyNamespaceList(xmlNsPtr cur) {
    xmlNsPtr ret = NULL;
    xmlNsPtr p = NULL,q;

    while (cur != NULL) {
        q = xmlCopyNamespace(cur);
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}